

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecFlt.h
# Opt level: O2

void Vec_FltFill(Vec_Flt_t *p,int nSize,float Entry)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (p->nCap < nSize) {
    if (p->pArray == (float *)0x0) {
      pfVar1 = (float *)malloc((long)nSize << 2);
    }
    else {
      pfVar1 = (float *)realloc(p->pArray,(long)nSize << 2);
    }
    p->pArray = pfVar1;
    p->nCap = nSize;
  }
  uVar2 = 0;
  uVar3 = 0;
  if (0 < nSize) {
    uVar3 = (ulong)(uint)nSize;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    p->pArray[uVar2] = 0.0;
  }
  p->nSize = nSize;
  return;
}

Assistant:

static inline void Vec_FltFill( Vec_Flt_t * p, int nSize, float Entry )
{
    int i;
    Vec_FltGrow( p, nSize );
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = Entry;
    p->nSize = nSize;
}